

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void DrawTextureTiled(Texture2D texture,Rectangle source,Rectangle dest,Vector2 origin,
                     float rotation,float scale,Color tint)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Rectangle source_00;
  Rectangle source_01;
  Rectangle source_02;
  Rectangle source_03;
  Rectangle source_04;
  Rectangle dest_00;
  Rectangle dest_01;
  Rectangle dest_02;
  Rectangle dest_03;
  Rectangle dest_04;
  Rectangle dest_05;
  undefined8 local_48;
  
  dest_03.width = dest.width;
  dest_04.height = dest.height;
  dest_03.x = dest.x;
  dest_04.y = dest.y;
  source_00.width = source.width;
  source_01.height = source.height;
  if (scale <= 0.0) {
    return;
  }
  if (texture.id == 0) {
    return;
  }
  iVar7 = (int)(source_01.height * scale);
  fVar10 = (float)(int)(source_00.width * scale);
  fVar11 = (float)iVar7;
  uVar1 = source._0_8_;
  if ((fVar10 <= dest_03.width) || (fVar11 <= dest_04.height)) {
    if (dest_03.width <= fVar10) {
      fVar9 = 0.0;
      if (fVar11 < dest_04.height) {
        iVar6 = 0;
        do {
          source_02.height = source_01.height;
          source_02.width = source_00.width * (dest_03.width / fVar10);
          dest_03.height = fVar11;
          source_02.x = (float)(int)uVar1;
          source_02.y = (float)(int)((ulong)uVar1 >> 0x20);
          dest_03.y = (float)iVar6 + dest_04.y;
          DrawTexturePro(texture,source_02,dest_03,origin,rotation,tint);
          iVar4 = iVar6 + iVar7 * 2;
          iVar6 = iVar6 + iVar7;
        } while ((float)iVar4 < dest_04.height);
        fVar9 = (float)iVar6;
      }
      if (dest_04.height <= fVar9) {
        return;
      }
      fVar10 = (dest_03.width / fVar10) * source_00.width;
      dest_04.height = dest_04.height - fVar9;
      fVar11 = (dest_04.height / fVar11) * source_01.height;
      dest_04.y = dest_04.y + fVar9;
      goto LAB_00144724;
    }
    iVar6 = (int)(source_00.width * scale);
    if (fVar11 < dest_04.height) {
      fVar9 = 0.0;
      if ((float)iVar6 < dest_03.width) {
        iVar4 = 0;
        iVar5 = iVar6;
        do {
          iVar2 = iVar5;
          fVar9 = 0.0;
          if (fVar11 < dest_04.height) {
            iVar5 = 0;
            do {
              dest_00.y = (float)iVar5 + dest_04.y;
              dest_00.x = dest_03.x + (float)iVar4;
              dest_00.height = fVar11;
              dest_00.width = fVar10;
              DrawTexturePro(texture,source,dest_00,origin,rotation,tint);
              iVar3 = iVar5 + iVar7 * 2;
              iVar5 = iVar5 + iVar7;
            } while ((float)iVar3 < dest_04.height);
            fVar9 = (float)iVar5;
          }
          if (fVar9 < dest_04.height) {
            dest_01.x = (float)iVar4 + dest_03.x;
            source_00.height = ((dest_04.height - fVar9) / fVar11) * source_01.height;
            source_00.x = (float)(int)uVar1;
            source_00.y = (float)(int)((ulong)uVar1 >> 0x20);
            dest_01.y = fVar9 + dest_04.y;
            dest_01.height = dest_04.height - fVar9;
            dest_01.width = fVar10;
            DrawTexturePro(texture,source_00,dest_01,origin,rotation,tint);
          }
          iVar4 = iVar2;
          iVar5 = iVar6 + iVar2;
        } while ((float)(iVar6 + iVar2) < dest_03.width);
        fVar9 = (float)iVar2;
      }
      if (fVar9 < dest_03.width) {
        fVar8 = 0.0;
        dest_03.width = dest_03.width - fVar9;
        if (fVar11 < dest_04.height) {
          iVar6 = 0;
          do {
            source_01.width = (dest_03.width / fVar10) * source_00.width;
            source_01.x = (float)(int)uVar1;
            source_01.y = (float)(int)((ulong)uVar1 >> 0x20);
            dest_02.y = (float)iVar6 + dest_04.y;
            dest_02.x = dest_03.x + fVar9;
            dest_02.width = dest_03.width;
            dest_02.height = fVar11;
            DrawTexturePro(texture,source_01,dest_02,origin,rotation,tint);
            iVar4 = iVar6 + iVar7 * 2;
            iVar6 = iVar6 + iVar7;
          } while ((float)iVar4 < dest_04.height);
          fVar8 = (float)iVar6;
        }
        if (fVar8 < dest_04.height) {
          fVar10 = (dest_03.width / fVar10) * source_00.width;
          dest_04.height = dest_04.height - fVar8;
          fVar11 = (dest_04.height / fVar11) * source_01.height;
          dest_03.x = fVar9 + dest_03.x;
          dest_04.y = dest_04.y + fVar8;
          goto LAB_00144724;
        }
      }
      return;
    }
    fVar9 = 0.0;
    if ((float)iVar6 < dest_03.width) {
      iVar7 = 0;
      do {
        source_03.height = source_01.height * (dest_04.height / fVar11);
        source_03.width = source_00.width;
        dest_04.width = fVar10;
        source_03.x = (float)(int)uVar1;
        source_03.y = (float)(int)((ulong)uVar1 >> 0x20);
        dest_04.x = (float)iVar7 + dest_03.x;
        DrawTexturePro(texture,source_03,dest_04,origin,rotation,tint);
        iVar4 = iVar6 * 2 + iVar7;
        iVar7 = iVar7 + iVar6;
      } while ((float)iVar4 < dest_03.width);
      fVar9 = (float)iVar7;
    }
    if (dest_03.width <= fVar9) {
      return;
    }
    dest_03.width = dest_03.width - fVar9;
    dest_03.x = dest_03.x + fVar9;
  }
  fVar10 = (dest_03.width / fVar10) * source_00.width;
  fVar11 = (dest_04.height / fVar11) * source_01.height;
LAB_00144724:
  source_04.height = fVar11;
  source_04.width = fVar10;
  source_04.x = (float)(int)uVar1;
  source_04.y = (float)(int)((ulong)uVar1 >> 0x20);
  dest_05.y = dest_04.y;
  dest_05.x = dest_03.x;
  dest_05.height = dest_04.height;
  dest_05.width = dest_03.width;
  DrawTexturePro(texture,source_04,dest_05,origin,rotation,tint);
  return;
}

Assistant:

void DrawTextureTiled(Texture2D texture, Rectangle source, Rectangle dest, Vector2 origin, float rotation, float scale, Color tint)
{
    if ((texture.id <= 0) || (scale <= 0.0f)) return;  // Wanna see a infinite loop?!...just delete this line!

    int tileWidth = (int)(source.width*scale), tileHeight = (int)(source.height*scale);
    if ((dest.width < tileWidth) && (dest.height < tileHeight))
    {
        // Can fit only one tile
        DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)dest.width/tileWidth)*source.width, ((float)dest.height/tileHeight)*source.height},
                    (Rectangle){dest.x, dest.y, dest.width, dest.height}, origin, rotation, tint);
    }
    else if (dest.width <= tileWidth)
    {
        // Tiled vertically (one column)
        int dy = 0;
        for (;dy+tileHeight < dest.height; dy += tileHeight)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)dest.width/tileWidth)*source.width, source.height}, (Rectangle){dest.x, dest.y + dy, dest.width, (float)tileHeight}, origin, rotation, tint);
        }

        // Fit last tile
        if (dy < dest.height)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)dest.width/tileWidth)*source.width, ((float)(dest.height - dy)/tileHeight)*source.height},
                        (Rectangle){dest.x, dest.y + dy, dest.width, dest.height - dy}, origin, rotation, tint);
        }
    }
    else if (dest.height <= tileHeight)
    {
        // Tiled horizontally (one row)
        int dx = 0;
        for (;dx+tileWidth < dest.width; dx += tileWidth)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, source.width, ((float)dest.height/tileHeight)*source.height}, (Rectangle){dest.x + dx, dest.y, (float)tileWidth, dest.height}, origin, rotation, tint);
        }

        // Fit last tile
        if (dx < dest.width)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)(dest.width - dx)/tileWidth)*source.width, ((float)dest.height/tileHeight)*source.height},
                        (Rectangle){dest.x + dx, dest.y, dest.width - dx, dest.height}, origin, rotation, tint);
        }
    }
    else
    {
        // Tiled both horizontally and vertically (rows and columns)
        int dx = 0;
        for (;dx+tileWidth < dest.width; dx += tileWidth)
        {
            int dy = 0;
            for (;dy+tileHeight < dest.height; dy += tileHeight)
            {
                DrawTexturePro(texture, source, (Rectangle){dest.x + dx, dest.y + dy, (float)tileWidth, (float)tileHeight}, origin, rotation, tint);
            }

            if (dy < dest.height)
            {
                DrawTexturePro(texture, (Rectangle){source.x, source.y, source.width, ((float)(dest.height - dy)/tileHeight)*source.height},
                    (Rectangle){dest.x + dx, dest.y + dy, (float)tileWidth, dest.height - dy}, origin, rotation, tint);
            }
        }

        // Fit last column of tiles
        if (dx < dest.width)
        {
            int dy = 0;
            for (;dy+tileHeight < dest.height; dy += tileHeight)
            {
                DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)(dest.width - dx)/tileWidth)*source.width, source.height},
                        (Rectangle){dest.x + dx, dest.y + dy, dest.width - dx, (float)tileHeight}, origin, rotation, tint);
            }

            // Draw final tile in the bottom right corner
            if (dy < dest.height)
            {
                DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)(dest.width - dx)/tileWidth)*source.width, ((float)(dest.height - dy)/tileHeight)*source.height},
                    (Rectangle){dest.x + dx, dest.y + dy, dest.width - dx, dest.height - dy}, origin, rotation, tint);
            }
        }
    }
}